

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

bool Cipher::normalizeSimilarityMap
               (TParameters *params,TSimilarityMap *ccMap,TSimilarityMap *logMap,
               TSimilarityMap *logMapInv)

{
  pointer pvVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pvVar1 = (ccMap->
           super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(ccMap->
                 super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
  iVar5 = (int)uVar4;
  iVar3 = 1;
  if (1 < iVar5) {
    iVar3 = iVar5;
  }
  dVar14 = 2.2250738585072014e-308;
  dVar15 = 1.79769313486232e+308;
  uVar6 = 1;
  lVar7 = 0x10;
  for (uVar8 = 0; uVar8 != iVar3 - 1; uVar8 = uVar8 + 1) {
    lVar9 = lVar7;
    for (uVar10 = uVar4 & 0xffffffff; uVar6 != uVar10; uVar10 = uVar10 - 1) {
      dVar12 = *(double *)
                (*(long *)&pvVar1[uVar8].super__Vector_base<stMatch,_std::allocator<stMatch>_>.
                           _M_impl.super__Vector_impl_data + lVar9);
      dVar13 = dVar12;
      if (dVar15 <= dVar12) {
        dVar13 = dVar15;
      }
      if (dVar12 <= dVar14) {
        dVar12 = dVar14;
      }
      lVar9 = lVar9 + 0x10;
      dVar14 = dVar12;
      dVar15 = dVar13;
    }
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x10;
  }
  uVar8 = 0;
  uVar6 = uVar4 & 0xffffffff;
  if (iVar5 < 1) {
    uVar6 = uVar8;
  }
  for (uVar10 = 0; uVar10 != uVar6; uVar10 = uVar10 + 1) {
    for (uVar11 = 0; (uVar4 & 0xffffffff) << 4 != uVar11; uVar11 = uVar11 + 0x10) {
      lVar7 = *(long *)&(ccMap->
                        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar10].
                        super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                        super__Vector_impl_data;
      if (uVar8 == uVar11) {
        *(undefined8 *)(lVar7 + uVar10 * 0x10) = 0x3ff0000000000000;
      }
      else {
        dVar12 = (*(double *)(lVar7 + uVar11) - (dVar15 + -1e-06)) /
                 ((dVar14 + 1e-06) - (dVar15 + -1e-06));
        *(double *)(lVar7 + uVar11) = dVar12;
        dVar12 = pow(dVar12,params->fSpread);
        *(double *)(lVar7 + uVar11) = dVar12;
      }
    }
    uVar8 = uVar8 + 0x10;
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(logMap,ccMap);
  lVar7 = 0;
  for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    for (lVar9 = 0; (uVar4 & 0xffffffff) << 4 != lVar9; lVar9 = lVar9 + 0x10) {
      lVar2 = *(long *)&(logMap->
                        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar8].
                        super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                        super__Vector_impl_data;
      if (lVar7 == lVar9) {
        *(undefined8 *)(lVar2 + uVar8 * 0x10) = 0;
      }
      else {
        dVar14 = log(*(double *)(lVar2 + lVar9));
        *(double *)(lVar2 + lVar9) = dVar14;
      }
    }
    lVar7 = lVar7 + 0x10;
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(logMapInv,ccMap);
  lVar7 = 0;
  for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    for (lVar9 = 0; (uVar4 & 0xffffffff) << 4 != lVar9; lVar9 = lVar9 + 0x10) {
      if (lVar7 == lVar9) {
        *(undefined8 *)
         (*(long *)&(logMap->
                    super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar8].
                    super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                    super__Vector_impl_data + uVar8 * 0x10) = 0xc12e848000000000;
      }
      else {
        lVar2 = *(long *)&(logMapInv->
                          super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar8].
                          super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                          super__Vector_impl_data;
        dVar14 = log(1.0 - *(double *)(lVar2 + lVar9));
        *(double *)(lVar2 + lVar9) = dVar14;
      }
    }
    lVar7 = lVar7 + 0x10;
  }
  return true;
}

Assistant:

bool normalizeSimilarityMap(
            const TParameters & params,
            TSimilarityMap & ccMap,
            TSimilarityMap & logMap,
            TSimilarityMap & logMapInv) {
        int n = ccMap.size();

        double ccMin = std::numeric_limits<double>::max();
        double ccMax = std::numeric_limits<double>::min();

        for (int j = 0; j < n - 1; ++j) {
            for (int i = j + 1; i < n; ++i) {
                ccMin = std::min(ccMin, ccMap[j][i].cc);
                ccMax = std::max(ccMax, ccMap[j][i].cc);
            }
        }

        ccMin -= 1e-6;
        ccMax += 1e-6;

        //printf("ccMax = %g, ccMin = %g\n", ccMax, ccMin);

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    ccMap[j][i].cc = 1.0;
                    continue;
                }

                auto & v = ccMap[j][i].cc;
                v = (v - ccMin)/(ccMax - ccMin);
                v = std::pow(v, params.fSpread);
                //if (v < 0.50) {
                //    v = 1e-6;
                //}
                //v = 1.0 - std::exp(-1.1f*v);
            }
        }

        logMap = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = 0.0;
                    continue;
                }

                auto & v = logMap[j][i].cc;
                v = std::log(v);
            }
        }

        logMapInv = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = -1e6;
                    continue;
                }

                auto & v = logMapInv[j][i].cc;
                v = std::log(1.0 - v);
            }
        }

        return true;
    }